

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.h
# Opt level: O1

void __thiscall FIX::Trailer::Trailer(Trailer *this)

{
  long *plVar1;
  void *pvVar2;
  atomic<long> *counter;
  message_order local_28;
  
  local_28.m_mode = trailer;
  local_28.m_delim = 0;
  local_28.m_groupOrder.m_size._0_4_ = 0;
  local_28.m_groupOrder.m_size._4_4_ = 0;
  local_28.m_groupOrder.m_buffer._0_4_ = 0;
  local_28.m_groupOrder.m_buffer._4_4_ = 0;
  local_28.m_largest = 0;
  FieldMap::FieldMap(&this->super_FieldMap,&local_28,1);
  plVar1 = (long *)CONCAT44(local_28.m_groupOrder.m_buffer._4_4_,
                            local_28.m_groupOrder.m_buffer._0_4_);
  if (plVar1 != (long *)0x0) {
    LOCK();
    *plVar1 = *plVar1 + -1;
    UNLOCK();
    if (*plVar1 == 0) {
      pvVar2 = (void *)CONCAT44(local_28.m_groupOrder.m_buffer._4_4_,
                                local_28.m_groupOrder.m_buffer._0_4_);
      local_28.m_groupOrder.m_size._0_4_ = 0;
      local_28.m_groupOrder.m_size._4_4_ = 0;
      local_28.m_groupOrder.m_buffer._0_4_ = 0;
      local_28.m_groupOrder.m_buffer._4_4_ = 0;
      if (pvVar2 != (void *)0x0) {
        operator_delete__(pvVar2);
      }
    }
  }
  (this->super_FieldMap)._vptr_FieldMap = (_func_int **)&PTR__FieldMap_001f9340;
  return;
}

Assistant:

Trailer()
      : FieldMap(message_order(message_order::trailer), REQUIRED_FIELDS) {}